

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall Parser::parseOrExpr(Parser *this)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  pointer pcVar3;
  pointer *__ptr;
  Parser *in_RSI;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> right;
  _Alloc_hider local_30;
  
  parseAndExpr(this);
  if ((in_RSI->m_currToken).type == Or) {
    do {
      eatToken(in_RSI,Or);
      parseAndExpr((Parser *)&stack0xffffffffffffffd0);
      pcVar3 = (pointer)operator_new(0x20);
      _Var2._M_p = local_30._M_p;
      pcVar1 = (this->m_lexer).m_input._M_dataplus._M_p;
      (this->m_lexer).m_input._M_dataplus._M_p = (pointer)0x0;
      local_30._M_p = (pointer)0x0;
      *(undefined ***)pcVar3 = &PTR__BinaryExpr_00182a48;
      pcVar3[8] = '\x06';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      *(pointer *)(pcVar3 + 0x10) = pcVar1;
      *(pointer *)(pcVar3 + 0x18) = _Var2._M_p;
      (this->m_lexer).m_input._M_dataplus._M_p = pcVar3;
    } while ((in_RSI->m_currToken).type == Or);
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseOrExpr() {
    std::unique_ptr<AST::Expr> expr = parseAndExpr();
    while (m_currToken.type == TokenType::Or) {
        eatToken(m_currToken.type);
        auto right = parseAndExpr();
        expr = std::make_unique<AST::BinaryExpr>(TokenType::Or,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}